

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateSmallDenseSeeds.cpp
# Opt level: O2

int main(void)

{
  undefined1 auVar1 [16];
  atomic<unsigned_int> aVar2;
  uint i;
  int iVar3;
  WirehairResult WVar4;
  uint32_t block_bytes;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int trial;
  uint block_id;
  uint64_t uVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  undefined4 uVar15;
  uint uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  __atomic_base<unsigned_int> local_fc5c;
  int local_fc58;
  int local_fc54;
  int local_fc50;
  uint64_t local_fc48;
  Codec encoder;
  Codec decoder;
  uint8_t encodedData [1];
  
  auVar19 = vmovdqu64_avx512f(wirehair::kTinyDenseCounts._0_64_);
  auVar20 = vmovdqu64_avx512f(wirehair::kTinyDenseSeeds._0_64_);
  auVar21 = vmovdqu64_avx512f(wirehair::kTinyDenseSeeds._64_64_);
  kTinyDenseCounts[0x40] = '\x13';
  kTinyDenseCounts._0_64_ = vmovdqu64_avx512f(auVar19);
  kTinyDenseSeeds[0x40] = 0x76e;
  kTinyDenseSeeds._0_64_ = vmovdqu64_avx512f(auVar20);
  kTinyDenseSeeds._64_64_ = vmovdqu64_avx512f(auVar21);
  memcpy(kSmallDenseSeeds,wirehair::kSmallDenseSeeds,0x7bf);
  memcpy(kSmallPeelSeeds,wirehair::kSmallPeelSeeds,0x800);
  iVar3 = gf256_init_(2);
  if (iVar3 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"GF256 init failed");
    std::endl<char,std::char_traits<char>>(poVar5);
    return -1;
  }
  for (lVar6 = 0; lVar6 != 64000; lVar6 = lVar6 + 1) {
    Message[lVar6] = (uint8_t)lVar6;
  }
  bVar8 = true;
  local_fc48 = siamese::GetTimeUsec();
  do {
    if (!bVar8) {
      poVar5 = std::operator<<((ostream *)&std::cout,"static const unsigned kTinyTableCount = ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,";");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"static const unsigned kSmallTableCount = ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,";");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "const uint8_t kTinyDenseCounts[kTinyTableCount] = {");
      uVar7 = 0;
      do {
        std::endl<char,std::char_traits<char>>(poVar5);
        uVar13 = (ulong)((uint)uVar7 & 0x1f);
        do {
          if (uVar7 == 0x41) {
            poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar5 = std::operator<<(poVar5,"};");
            poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
            std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "const uint16_t kTinyDenseSeeds[kTinyTableCount] = {");
            uVar7 = 0;
            do {
              std::endl<char,std::char_traits<char>>(poVar5);
              uVar12 = (uint)uVar7;
              lVar6 = uVar7 * 2;
              lVar14 = 0;
              do {
                if (uVar7 == 0x41) {
                  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  poVar5 = std::operator<<(poVar5,"};");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  poVar5 = std::operator<<(poVar5,
                                           "// This table skips the first kTinyTableCount elements")
                  ;
                  std::endl<char,std::char_traits<char>>(poVar5);
                  poVar5 = std::operator<<((ostream *)&std::cout,
                                           "const uint8_t kSmallDenseSeeds[kSmallTableCount] = {");
                  uVar7 = 0;
                  do {
                    std::endl<char,std::char_traits<char>>(poVar5);
                    uVar13 = (ulong)((uint)uVar7 & 0x1f);
                    do {
                      if (uVar7 == 0x7bf) {
                        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        poVar5 = std::operator<<(poVar5,"};");
                        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
                        std::endl<char,std::char_traits<char>>(poVar5);
                        poVar5 = std::operator<<((ostream *)&std::cout,
                                                 "const uint8_t kSmallPeelSeeds[kTinyTableCount + kSmallTableCount] = {"
                                                );
                        uVar7 = 0;
                        do {
                          std::endl<char,std::char_traits<char>>(poVar5);
                          uVar13 = (ulong)((uint)uVar7 & 0x1f);
                          do {
                            if (uVar7 == 0x800) {
                              poVar5 = std::operator<<((ostream *)&std::cout,"};");
                              std::endl<char,std::char_traits<char>>(poVar5);
                              return 0;
                            }
                            if (uVar13 == 0) {
                              std::operator<<((ostream *)&std::cout,"    ");
                            }
                            poVar5 = (ostream *)
                                     std::ostream::operator<<
                                               ((ostream *)&std::cout,(uint)kSmallPeelSeeds[uVar7]);
                            std::operator<<(poVar5,",");
                            uVar7 = uVar7 + 1;
                            uVar13 = uVar13 + 1;
                          } while ((uVar7 & 0x1f) != 0);
                          poVar5 = (ostream *)&std::cout;
                        } while( true );
                      }
                      if (uVar13 == 0) {
                        std::operator<<((ostream *)&std::cout,"    ");
                      }
                      poVar5 = (ostream *)
                               std::ostream::operator<<
                                         ((ostream *)&std::cout,(uint)kSmallDenseSeeds[uVar7]);
                      std::operator<<(poVar5,",");
                      uVar7 = uVar7 + 1;
                      uVar13 = uVar13 + 1;
                    } while ((uVar7 & 0x1f) != 0);
                    poVar5 = (ostream *)&std::cout;
                  } while( true );
                }
                if ((ulong)((uVar12 & 0x1f) * 2) + lVar14 == 0) {
                  std::operator<<((ostream *)&std::cout,"    ");
                }
                poVar5 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)&std::cout,
                                    (uint)*(ushort *)((long)kTinyDenseSeeds + lVar6 + lVar14));
                std::operator<<(poVar5,",");
                uVar7 = uVar7 + 1;
                lVar14 = lVar14 + 2;
              } while ((uVar7 & 0x1f) != 0);
              poVar5 = (ostream *)&std::cout;
            } while( true );
          }
          if (uVar13 == 0) {
            std::operator<<((ostream *)&std::cout,"    ");
          }
          poVar5 = (ostream *)
                   std::ostream::operator<<((ostream *)&std::cout,(uint)kTinyDenseCounts[uVar7]);
          std::operator<<(poVar5,",");
          uVar7 = uVar7 + 1;
          uVar13 = uVar13 + 1;
        } while ((uVar7 & 0x1f) != 0);
        poVar5 = (ostream *)&std::cout;
      } while( true );
    }
    local_fc5c._M_i = 10000;
    local_fc50 = 0;
    local_fc54 = 0;
    for (iVar3 = 0xb; iVar3 != 0x10; iVar3 = iVar3 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"For N = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11);
      poVar5 = std::operator<<(poVar5," trying count = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
      for (iVar17 = 0; iVar17 != 0x10000; iVar17 = iVar17 + 1) {
        local_fc48 = local_fc48 + 1;
        uVar9 = 0;
        LOCK();
        FailedTrials.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
        UNLOCK();
        for (; aVar2.super___atomic_base<unsigned_int>._M_i =
                    FailedTrials.super___atomic_base<unsigned_int>._M_i, uVar9 != 0xdac;
            uVar9 = uVar9 + 1) {
          encoder._block_bytes = 0;
          encoder._block_count = 0;
          encoder._block_next_prime = 0;
          encoder._seed_override = false;
          encoder._9_1_ = 0;
          encoder._dense_count = 0;
          encoder._p_seed = 0;
          siamese::PCGRandom::Seed((PCGRandom *)&encoder,local_fc48,uVar9);
          uVar7 = encoder._0_8_ * 0x5851f42d4c957f2d + encoder._8_8_;
          auVar22._8_8_ = 0;
          auVar22._0_4_ = encoder._block_bytes;
          auVar22._4_2_ = encoder._block_count;
          auVar22._6_2_ = encoder._block_next_prime;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar7;
          auVar22 = vpunpcklqdq_avx(auVar18,auVar22);
          auVar18 = vpsrlvq_avx2(auVar22,_DAT_00108010);
          auVar1 = vpsrlvq_avx2(auVar22,_DAT_00108020);
          auVar22 = vpsrlq_avx(auVar22,0x3b);
          auVar22 = vpshufd_avx(auVar22,0xe8);
          encoder._0_8_ = uVar7 * 0x5851f42d4c957f2d + encoder._8_8_;
          auVar18 = vpshufd_avx(auVar1 ^ auVar18,0xe8);
          auVar18 = vprorvd_avx512vl(auVar18,auVar22);
          auVar22 = vpshufd_avx(auVar18,0x55);
          uVar15 = vpextrw_avx(auVar18 ^ auVar22,0);
          wirehair::Codec::Codec((Codec *)encodedData);
          wirehair::Codec::OverrideSeeds
                    ((Codec *)encodedData,(uint16_t)iVar3,(uint16_t)uVar15,(uint16_t)iVar17);
          WVar4 = wirehair::Codec::InitializeEncoder((Codec *)encodedData,0x11,1);
          if ((WVar4 != Wirehair_Success) ||
             (WVar4 = wirehair::Codec::EncodeFeed((Codec *)encodedData,Message),
             WVar4 != Wirehair_Success)) {
            LOCK();
            FailedTrials.super___atomic_base<unsigned_int>._M_i =
                 (__atomic_base<unsigned_int>)
                 ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 1);
            UNLOCK();
          }
          wirehair::Codec::~Codec((Codec *)encodedData);
        }
        if ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i < (int)local_fc5c._M_i) {
          poVar5 = std::operator<<((ostream *)&std::cout,"*** New best dense: N = ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11);
          poVar5 = std::operator<<(poVar5,": Best dense seed = ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar17);
          poVar5 = std::operator<<(poVar5,", best count = ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          poVar5 = std::operator<<(poVar5,", best failures = ");
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,(int)aVar2.super___atomic_base<unsigned_int>._M_i);
          std::endl<char,std::char_traits<char>>(poVar5);
          local_fc5c = aVar2.super___atomic_base<unsigned_int>._M_i;
          local_fc54 = iVar3;
          local_fc50 = iVar17;
          if ((int)aVar2.super___atomic_base<unsigned_int>._M_i < 1) {
            break;
          }
        }
      }
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"N = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11);
    poVar5 = std::operator<<(poVar5,": Best dense seed = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_fc50);
    poVar5 = std::operator<<(poVar5,", best count = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_fc54);
    poVar5 = std::operator<<(poVar5,", best failures = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_fc5c._M_i);
    std::endl<char,std::char_traits<char>>(poVar5);
    local_fc5c._M_i = 100000;
    local_fc58 = 0;
    uVar9 = local_fc48 + 0x10000;
    for (iVar3 = 0; iVar3 != 0x10000; iVar3 = iVar3 + 1) {
      local_fc48 = local_fc48 + 1;
      uVar12 = 0;
      LOCK();
      FailedTrials.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
      UNLOCK();
      for (; aVar2.super___atomic_base<unsigned_int>._M_i =
                  FailedTrials.super___atomic_base<unsigned_int>._M_i, uVar11 = uVar12,
          uVar12 != 0x11; uVar12 = uVar12 + 1) {
        for (; uVar11 != 0x11; uVar11 = uVar11 + 1) {
          wirehair::Codec::Codec(&encoder);
          wirehair::Codec::Codec(&decoder);
          wirehair::Codec::OverrideSeeds
                    (&encoder,(uint16_t)local_fc54,(uint16_t)iVar3,(uint16_t)local_fc50);
          wirehair::Codec::OverrideSeeds
                    (&decoder,(uint16_t)local_fc54,(uint16_t)iVar3,(uint16_t)local_fc50);
          WVar4 = wirehair::Codec::InitializeEncoder(&encoder,0x11,1);
          if ((WVar4 == Wirehair_Success) &&
             (WVar4 = wirehair::Codec::EncodeFeed(&encoder,Message), WVar4 == Wirehair_Success)) {
            WVar4 = wirehair::Codec::InitializeDecoder(&decoder,0x11,1);
            if (WVar4 != Wirehair_Success) {
              poVar5 = std::operator<<((ostream *)&std::cout,"InitializeDecoder failed");
              std::endl<char,std::char_traits<char>>(poVar5);
              goto LAB_001017ef;
            }
            uVar16 = 0;
            for (block_id = 0; uVar11 == block_id || uVar12 == block_id; block_id = block_id + 1) {
LAB_0010186a:
            }
            block_bytes = wirehair::Codec::Encode(&encoder,block_id,(Codec *)encodedData,1);
            if (block_bytes == 0) {
              pcVar10 = "Encode failed";
LAB_0010189f:
              poVar5 = std::operator<<((ostream *)&std::cout,pcVar10);
              std::endl<char,std::char_traits<char>>(poVar5);
LAB_001018b3:
              LOCK();
              FailedTrials.super___atomic_base<unsigned_int>._M_i =
                   (__atomic_base<unsigned_int>)
                   ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 10000);
              UNLOCK();
            }
            else {
              WVar4 = wirehair::Codec::DecodeFeed
                                (&decoder,block_id,(Codec *)encodedData,block_bytes);
              if (WVar4 == Wirehair_NeedMore) {
                uVar16 = uVar16 + 1;
                if (block_id < 0x1c) goto LAB_0010186a;
                goto LAB_001018b3;
              }
              pcVar10 = "DecodeFeed failed";
              if (WVar4 != Wirehair_Success) goto LAB_0010189f;
              if (uVar16 - 0x10 < 3) {
                iVar17 = *(int *)(&DAT_001082cc + (ulong)(uVar16 - 0x10) * 4);
              }
              else {
                iVar17 = 0;
                if (0x13 < uVar16 + 1) {
                  iVar17 = uVar16 * 3 + -0x30;
                }
              }
              LOCK();
              FailedTrials.super___atomic_base<unsigned_int>._M_i =
                   (__atomic_base<unsigned_int>)
                   ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + iVar17);
              UNLOCK();
              WVar4 = wirehair::Codec::ReconstructOutput(&decoder,(Codec *)encodedData,0x11);
              pcVar10 = "ReconstructOutput failed";
              if (WVar4 != Wirehair_Success) {
LAB_0010191f:
                poVar5 = std::operator<<((ostream *)&std::cout,pcVar10);
                std::endl<char,std::char_traits<char>>(poVar5);
                goto LAB_001017ef;
              }
              iVar17 = bcmp((Codec *)encodedData,Message,0x11);
              pcVar10 = "memcmp failed";
              if (iVar17 != 0) goto LAB_0010191f;
            }
          }
          else {
LAB_001017ef:
            LOCK();
            FailedTrials.super___atomic_base<unsigned_int>._M_i =
                 (__atomic_base<unsigned_int>)
                 ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 10000);
            UNLOCK();
          }
          wirehair::Codec::~Codec(&decoder);
          wirehair::Codec::~Codec(&encoder);
        }
      }
      if ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i < (int)local_fc5c._M_i) {
        poVar5 = std::operator<<((ostream *)&std::cout,"*** New best peel: N = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11);
        poVar5 = std::operator<<(poVar5,": Best peel seed = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        poVar5 = std::operator<<(poVar5," fails = ");
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,(int)aVar2.super___atomic_base<unsigned_int>._M_i);
        std::endl<char,std::char_traits<char>>(poVar5);
        local_fc5c = aVar2.super___atomic_base<unsigned_int>._M_i;
        local_fc58 = iVar3;
        if ((int)aVar2.super___atomic_base<unsigned_int>._M_i < 1) {
          uVar9 = local_fc48;
          break;
        }
      }
    }
    local_fc48 = uVar9;
    poVar5 = std::operator<<((ostream *)&std::cout,"N = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x11);
    poVar5 = std::operator<<(poVar5,": Best peel seed = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_fc58);
    poVar5 = std::operator<<(poVar5," fails = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_fc5c._M_i);
    std::endl<char,std::char_traits<char>>(poVar5);
    kSmallPeelSeeds[0x11] = (uint8_t)local_fc58;
    bVar8 = false;
    kTinyDenseCounts[0x11] = (uint8_t)local_fc54;
    kTinyDenseSeeds[0x11] = (uint16_t)local_fc50;
  } while( true );
}

Assistant:

void FillTables()
{
    memcpy(kTinyDenseCounts, wirehair::kTinyDenseCounts, sizeof(kTinyDenseCounts));
    memcpy(kTinyDenseSeeds, wirehair::kTinyDenseSeeds, sizeof(kTinyDenseSeeds));
    memcpy(kSmallDenseSeeds, wirehair::kSmallDenseSeeds, sizeof(kSmallDenseSeeds));
    memcpy(kSmallPeelSeeds, wirehair::kSmallPeelSeeds, sizeof(kSmallPeelSeeds));
}